

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O2

bool __thiscall
gguf_reader::read<long>(gguf_reader *this,vector<long,_std::allocator<long>_> *dst,size_t n)

{
  pointer plVar1;
  bool bVar2;
  long *dst_00;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  std::vector<long,_std::allocator<long>_>::resize(dst,n);
  uVar5 = 0xffffffffffffffff;
  lVar3 = 0;
  do {
    plVar1 = (dst->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    uVar4 = (long)(dst->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)plVar1 >> 3;
    uVar5 = uVar5 + 1;
    if (uVar4 <= uVar5) break;
    dst_00 = (long *)((long)plVar1 + lVar3);
    lVar3 = lVar3 + 8;
    bVar2 = read<long>(this,dst_00);
  } while (bVar2);
  return uVar4 <= uVar5;
}

Assistant:

bool read(std::vector<T> & dst, const size_t n) const {
        dst.resize(n);
        for (size_t i = 0; i < dst.size(); ++i) {
            if constexpr (std::is_same<T, bool>::value) {
                bool tmp;
                if (!read(tmp)) {
                    return false;
                }
                dst[i] = tmp;
            } else {
                if (!read(dst[i])) {
                    return false;
                }
            }
        }
        return true;
    }